

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::~QAction(QAction *this)

{
  int id;
  long *plVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  QShortcutMap *this_00;
  long in_FS_OFFSET;
  QKeySequence local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007895b8;
  plVar1 = *(long **)&this->field_0x8;
  (**(code **)(*plVar1 + 0x20))(plVar1);
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)(plVar1 + 0xf));
  if (bVar4) {
    QActionGroup::removeAction((QActionGroup *)plVar1[0x10],this);
  }
  if (QCoreApplication::self != 0) {
    lVar2 = plVar1[0x2c];
    lVar3 = plVar1[0x2d];
    for (lVar5 = 0; lVar3 << 2 != lVar5; lVar5 = lVar5 + 4) {
      id = *(int *)(lVar2 + lVar5);
      if (id != 0) {
        this_00 = &QGuiApplicationPrivate::self->shortcutMap;
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::removeShortcut(this_00,id,&this->super_QObject,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
    }
  }
  QObject::~QObject(&this->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAction::~QAction()
{
    Q_D(QAction);

    d->destroy();

    if (d->group)
        d->group->removeAction(this);
#if QT_CONFIG(shortcut)
    if (qApp) {
        for (int id : std::as_const(d->shortcutIds)) {
            if (id)
                QGuiApplicationPrivate::instance()->shortcutMap.removeShortcut(id, this);
        }
    }
#endif
}